

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-misc.c
# Opt level: O1

int greatest_name_match(char *name,char *filter,int res_if_none)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_t __n;
  size_t sVar4;
  char *__s1;
  
  if (name == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(name);
  }
  iVar3 = (int)filter;
  if (__n != 0) {
    if ((greatest_info.exact_name_match != '\0') &&
       (sVar4 = strlen(greatest_info.name_buf), sVar4 != __n)) {
      return 0;
    }
    iVar3 = 0;
    if (greatest_info.name_buf[0] != '\0') {
      cVar1 = *name;
      __s1 = greatest_info.name_buf;
      cVar2 = greatest_info.name_buf[0];
      do {
        if ((cVar2 == cVar1) && (iVar3 = strncmp(__s1,name,__n), iVar3 == 0)) {
          return 1;
        }
        cVar2 = __s1[1];
        __s1 = __s1 + 1;
        iVar3 = 0;
      } while (cVar2 != '\0');
    }
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(test_example);
    RUN_TEST(calling_fread);
    RUN_TEST(calling_calloc_0_0);
    RUN_TEST(calling_malloc_0);
    RUN_TEST(calling_enum_lookup);

    GREATEST_MAIN_END(); /* display results */
}